

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::LayerParameter::InternalSerializeWithCachedSizesToArray
          (LayerParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  string *psVar2;
  char *pcVar3;
  Type *pTVar4;
  uint8 *puVar5;
  Type *value;
  Type *value_00;
  Type *pTVar6;
  UnknownFieldSet *unknown_fields;
  int iVar7;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar8;
  int iVar9;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->name_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.LayerParameter.name");
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (1,(this->name_).ptr_,target);
  }
  if ((uVar1 & 2) != 0) {
    psVar2 = (this->type_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,SERIALIZE,
               "caffe.LayerParameter.type");
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray
                       (2,(this->type_).ptr_,target);
  }
  iVar7 = (this->bottom_).super_RepeatedPtrFieldBase.current_size_;
  iVar9 = 0;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  pRVar8 = &this->bottom_;
  for (; iVar7 != iVar9; iVar9 = iVar9 + 1) {
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar8->super_RepeatedPtrFieldBase,iVar9);
    pcVar3 = (pTVar4->_M_dataplus)._M_p;
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar8->super_RepeatedPtrFieldBase,iVar9);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar3,(int)pTVar4->_M_string_length,SERIALIZE,"caffe.LayerParameter.bottom");
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar8->super_RepeatedPtrFieldBase,iVar9);
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray(3,pTVar4,target);
  }
  iVar7 = (this->top_).super_RepeatedPtrFieldBase.current_size_;
  iVar9 = 0;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  pRVar8 = &this->top_;
  for (; iVar7 != iVar9; iVar9 = iVar9 + 1) {
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar8->super_RepeatedPtrFieldBase,iVar9);
    pcVar3 = (pTVar4->_M_dataplus)._M_p;
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar8->super_RepeatedPtrFieldBase,iVar9);
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar3,(int)pTVar4->_M_string_length,SERIALIZE,"caffe.LayerParameter.top");
    pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&pRVar8->super_RepeatedPtrFieldBase,iVar9);
    target = google::protobuf::internal::WireFormatLite::WriteStringToArray(4,pTVar4,target);
  }
  puVar5 = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                     (5,&this->loss_weight_,target);
  iVar7 = (this->param_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar9 = 0; iVar7 != iVar9; iVar9 = iVar9 + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::ParamSpec>::TypeHandler>
                      (&(this->param_).super_RepeatedPtrFieldBase,iVar9);
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ParamSpec>(6,value,deterministic,puVar5);
  }
  iVar7 = (this->blobs_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar9 = 0; iVar7 != iVar9; iVar9 = iVar9 + 1) {
    value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
                         (&(this->blobs_).super_RepeatedPtrFieldBase,iVar9);
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::BlobProto>(7,value_00,deterministic,puVar5)
    ;
  }
  iVar7 = (this->include_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar9 = 0; iVar7 != iVar9; iVar9 = iVar9 + 1) {
    pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
                       (&(this->include_).super_RepeatedPtrFieldBase,iVar9);
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::NetStateRule>
                       (8,pTVar6,deterministic,puVar5);
  }
  iVar7 = (this->exclude_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar9 = 0; iVar7 != iVar9; iVar9 = iVar9 + 1) {
    pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<caffe::NetStateRule>::TypeHandler>
                       (&(this->exclude_).super_RepeatedPtrFieldBase,iVar9);
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::NetStateRule>
                       (9,pTVar6,deterministic,puVar5);
  }
  if ((*(byte *)((long)(this->_has_bits_).has_bits_ + 6) & 2) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::WriteEnumToArray(10,this->phase_,puVar5);
  }
  puVar5 = google::protobuf::internal::WireFormatLite::WriteBoolToArray
                     (0xb,&this->propagate_down_,puVar5);
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 4) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::TransformationParameter>
                       (100,this->transform_param_,deterministic,puVar5);
  }
  if ((uVar1 & 8) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::LossParameter>
                       (0x65,this->loss_param_,deterministic,puVar5);
  }
  if ((uVar1 & 0x10) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::AccuracyParameter>
                       (0x66,this->accuracy_param_,deterministic,puVar5);
  }
  if ((uVar1 & 0x20) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ArgMaxParameter>
                       (0x67,this->argmax_param_,deterministic,puVar5);
  }
  if ((uVar1 & 0x40) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ConcatParameter>
                       (0x68,this->concat_param_,deterministic,puVar5);
  }
  if ((char)uVar1 < '\0') {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ContrastiveLossParameter>
                       (0x69,this->contrastive_loss_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ConvolutionParameter>
                       (0x6a,this->convolution_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 9 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::DataParameter>
                       (0x6b,this->data_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 10 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::DropoutParameter>
                       (0x6c,this->dropout_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::DummyDataParameter>
                       (0x6d,this->dummy_data_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::EltwiseParameter>
                       (0x6e,this->eltwise_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ExpParameter>
                       (0x6f,this->exp_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::HDF5DataParameter>
                       (0x70,this->hdf5_data_param_,deterministic,puVar5);
  }
  if ((short)uVar1 < 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::HDF5OutputParameter>
                       (0x71,this->hdf5_output_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::HingeLossParameter>
                       (0x72,this->hinge_loss_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x11 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ImageDataParameter>
                       (0x73,this->image_data_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x12 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::InfogainLossParameter>
                       (0x74,this->infogain_loss_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x13 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::InnerProductParameter>
                       (0x75,this->inner_product_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x14 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::LRNParameter>
                       (0x76,this->lrn_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x15 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::MemoryDataParameter>
                       (0x77,this->memory_data_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x16 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::MVNParameter>
                       (0x78,this->mvn_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x17 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::PoolingParameter>
                       (0x79,this->pooling_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x18 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::PowerParameter>
                       (0x7a,this->power_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x19 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ReLUParameter>
                       (0x7b,this->relu_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x1a & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::SigmoidParameter>
                       (0x7c,this->sigmoid_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x1b & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::SoftmaxParameter>
                       (0x7d,this->softmax_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x1c & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::SliceParameter>
                       (0x7e,this->slice_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x1d & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::TanHParameter>
                       (0x7f,this->tanh_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x1e & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ThresholdParameter>
                       (0x80,this->threshold_param_,deterministic,puVar5);
  }
  if ((int)uVar1 < 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::WindowDataParameter>
                       (0x81,this->window_data_param_,deterministic,puVar5);
  }
  uVar1 = (this->_has_bits_).has_bits_[1];
  if ((uVar1 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::PythonParameter>
                       (0x82,this->python_param_,deterministic,puVar5);
  }
  if ((uVar1 & 2) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::PReLUParameter>
                       (0x83,this->prelu_param_,deterministic,puVar5);
  }
  if ((uVar1 & 4) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::SPPParameter>
                       (0x84,this->spp_param_,deterministic,puVar5);
  }
  if ((uVar1 & 8) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ReshapeParameter>
                       (0x85,this->reshape_param_,deterministic,puVar5);
  }
  if ((uVar1 & 0x10) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::LogParameter>
                       (0x86,this->log_param_,deterministic,puVar5);
  }
  if ((uVar1 & 0x20) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::FlattenParameter>
                       (0x87,this->flatten_param_,deterministic,puVar5);
  }
  if ((uVar1 & 0x40) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ReductionParameter>
                       (0x88,this->reduction_param_,deterministic,puVar5);
  }
  if ((char)uVar1 < '\0') {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::EmbedParameter>
                       (0x89,this->embed_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::TileParameter>
                       (0x8a,this->tile_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 9 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::BatchNormParameter>
                       (0x8b,this->batch_norm_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 10 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ELUParameter>
                       (0x8c,this->elu_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::BiasParameter>
                       (0x8d,this->bias_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ScaleParameter>
                       (0x8e,this->scale_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::InputParameter>
                       (0x8f,this->input_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::CropParameter>
                       (0x90,this->crop_param_,deterministic,puVar5);
  }
  if ((short)uVar1 < 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::ParameterParameter>
                       (0x91,this->parameter_param_,deterministic,puVar5);
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    puVar5 = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::RecurrentParameter>
                       (0x92,this->recurrent_param_,deterministic,puVar5);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return puVar5;
  }
  unknown_fields = LayerParameter::unknown_fields(this);
  puVar5 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     (unknown_fields,puVar5);
  return puVar5;
}

Assistant:

::google::protobuf::uint8* LayerParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.LayerParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.LayerParameter.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string type = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type().data(), this->type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.LayerParameter.type");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->type(), target);
  }

  // repeated string bottom = 3;
  for (int i = 0, n = this->bottom_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->bottom(i).data(), this->bottom(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.LayerParameter.bottom");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(3, this->bottom(i), target);
  }

  // repeated string top = 4;
  for (int i = 0, n = this->top_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->top(i).data(), this->top(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.LayerParameter.top");
    target = ::google::protobuf::internal::WireFormatLite::
      WriteStringToArray(4, this->top(i), target);
  }

  // repeated float loss_weight = 5;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(5, this->loss_weight_, target);

  // repeated .caffe.ParamSpec param = 6;
  for (unsigned int i = 0, n = this->param_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, this->param(i), deterministic, target);
  }

  // repeated .caffe.BlobProto blobs = 7;
  for (unsigned int i = 0, n = this->blobs_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        7, this->blobs(i), deterministic, target);
  }

  // repeated .caffe.NetStateRule include = 8;
  for (unsigned int i = 0, n = this->include_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        8, this->include(i), deterministic, target);
  }

  // repeated .caffe.NetStateRule exclude = 9;
  for (unsigned int i = 0, n = this->exclude_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        9, this->exclude(i), deterministic, target);
  }

  cached_has_bits = _has_bits_[1];
  // optional .caffe.Phase phase = 10;
  if (cached_has_bits & 0x00020000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      10, this->phase(), target);
  }

  // repeated bool propagate_down = 11;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteBoolToArray(11, this->propagate_down_, target);

  cached_has_bits = _has_bits_[0];
  // optional .caffe.TransformationParameter transform_param = 100;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        100, *this->transform_param_, deterministic, target);
  }

  // optional .caffe.LossParameter loss_param = 101;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        101, *this->loss_param_, deterministic, target);
  }

  // optional .caffe.AccuracyParameter accuracy_param = 102;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        102, *this->accuracy_param_, deterministic, target);
  }

  // optional .caffe.ArgMaxParameter argmax_param = 103;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        103, *this->argmax_param_, deterministic, target);
  }

  // optional .caffe.ConcatParameter concat_param = 104;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        104, *this->concat_param_, deterministic, target);
  }

  // optional .caffe.ContrastiveLossParameter contrastive_loss_param = 105;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        105, *this->contrastive_loss_param_, deterministic, target);
  }

  // optional .caffe.ConvolutionParameter convolution_param = 106;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        106, *this->convolution_param_, deterministic, target);
  }

  // optional .caffe.DataParameter data_param = 107;
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        107, *this->data_param_, deterministic, target);
  }

  // optional .caffe.DropoutParameter dropout_param = 108;
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        108, *this->dropout_param_, deterministic, target);
  }

  // optional .caffe.DummyDataParameter dummy_data_param = 109;
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        109, *this->dummy_data_param_, deterministic, target);
  }

  // optional .caffe.EltwiseParameter eltwise_param = 110;
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        110, *this->eltwise_param_, deterministic, target);
  }

  // optional .caffe.ExpParameter exp_param = 111;
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        111, *this->exp_param_, deterministic, target);
  }

  // optional .caffe.HDF5DataParameter hdf5_data_param = 112;
  if (cached_has_bits & 0x00004000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        112, *this->hdf5_data_param_, deterministic, target);
  }

  // optional .caffe.HDF5OutputParameter hdf5_output_param = 113;
  if (cached_has_bits & 0x00008000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        113, *this->hdf5_output_param_, deterministic, target);
  }

  // optional .caffe.HingeLossParameter hinge_loss_param = 114;
  if (cached_has_bits & 0x00010000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        114, *this->hinge_loss_param_, deterministic, target);
  }

  // optional .caffe.ImageDataParameter image_data_param = 115;
  if (cached_has_bits & 0x00020000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        115, *this->image_data_param_, deterministic, target);
  }

  // optional .caffe.InfogainLossParameter infogain_loss_param = 116;
  if (cached_has_bits & 0x00040000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        116, *this->infogain_loss_param_, deterministic, target);
  }

  // optional .caffe.InnerProductParameter inner_product_param = 117;
  if (cached_has_bits & 0x00080000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        117, *this->inner_product_param_, deterministic, target);
  }

  // optional .caffe.LRNParameter lrn_param = 118;
  if (cached_has_bits & 0x00100000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        118, *this->lrn_param_, deterministic, target);
  }

  // optional .caffe.MemoryDataParameter memory_data_param = 119;
  if (cached_has_bits & 0x00200000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        119, *this->memory_data_param_, deterministic, target);
  }

  // optional .caffe.MVNParameter mvn_param = 120;
  if (cached_has_bits & 0x00400000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        120, *this->mvn_param_, deterministic, target);
  }

  // optional .caffe.PoolingParameter pooling_param = 121;
  if (cached_has_bits & 0x00800000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        121, *this->pooling_param_, deterministic, target);
  }

  // optional .caffe.PowerParameter power_param = 122;
  if (cached_has_bits & 0x01000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        122, *this->power_param_, deterministic, target);
  }

  // optional .caffe.ReLUParameter relu_param = 123;
  if (cached_has_bits & 0x02000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        123, *this->relu_param_, deterministic, target);
  }

  // optional .caffe.SigmoidParameter sigmoid_param = 124;
  if (cached_has_bits & 0x04000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        124, *this->sigmoid_param_, deterministic, target);
  }

  // optional .caffe.SoftmaxParameter softmax_param = 125;
  if (cached_has_bits & 0x08000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        125, *this->softmax_param_, deterministic, target);
  }

  // optional .caffe.SliceParameter slice_param = 126;
  if (cached_has_bits & 0x10000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        126, *this->slice_param_, deterministic, target);
  }

  // optional .caffe.TanHParameter tanh_param = 127;
  if (cached_has_bits & 0x20000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        127, *this->tanh_param_, deterministic, target);
  }

  // optional .caffe.ThresholdParameter threshold_param = 128;
  if (cached_has_bits & 0x40000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        128, *this->threshold_param_, deterministic, target);
  }

  // optional .caffe.WindowDataParameter window_data_param = 129;
  if (cached_has_bits & 0x80000000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        129, *this->window_data_param_, deterministic, target);
  }

  cached_has_bits = _has_bits_[1];
  // optional .caffe.PythonParameter python_param = 130;
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        130, *this->python_param_, deterministic, target);
  }

  // optional .caffe.PReLUParameter prelu_param = 131;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        131, *this->prelu_param_, deterministic, target);
  }

  // optional .caffe.SPPParameter spp_param = 132;
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        132, *this->spp_param_, deterministic, target);
  }

  // optional .caffe.ReshapeParameter reshape_param = 133;
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        133, *this->reshape_param_, deterministic, target);
  }

  // optional .caffe.LogParameter log_param = 134;
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        134, *this->log_param_, deterministic, target);
  }

  // optional .caffe.FlattenParameter flatten_param = 135;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        135, *this->flatten_param_, deterministic, target);
  }

  // optional .caffe.ReductionParameter reduction_param = 136;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        136, *this->reduction_param_, deterministic, target);
  }

  // optional .caffe.EmbedParameter embed_param = 137;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        137, *this->embed_param_, deterministic, target);
  }

  // optional .caffe.TileParameter tile_param = 138;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        138, *this->tile_param_, deterministic, target);
  }

  // optional .caffe.BatchNormParameter batch_norm_param = 139;
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        139, *this->batch_norm_param_, deterministic, target);
  }

  // optional .caffe.ELUParameter elu_param = 140;
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        140, *this->elu_param_, deterministic, target);
  }

  // optional .caffe.BiasParameter bias_param = 141;
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        141, *this->bias_param_, deterministic, target);
  }

  // optional .caffe.ScaleParameter scale_param = 142;
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        142, *this->scale_param_, deterministic, target);
  }

  // optional .caffe.InputParameter input_param = 143;
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        143, *this->input_param_, deterministic, target);
  }

  // optional .caffe.CropParameter crop_param = 144;
  if (cached_has_bits & 0x00004000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        144, *this->crop_param_, deterministic, target);
  }

  // optional .caffe.ParameterParameter parameter_param = 145;
  if (cached_has_bits & 0x00008000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        145, *this->parameter_param_, deterministic, target);
  }

  // optional .caffe.RecurrentParameter recurrent_param = 146;
  if (cached_has_bits & 0x00010000u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        146, *this->recurrent_param_, deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.LayerParameter)
  return target;
}